

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  HttpSocket *this;
  SocketSet ss;
  POST post;
  undefined1 local_78 [16];
  _Rb_tree_node_base local_68;
  size_t local_48;
  POST local_40;
  
  signal(0xd,(__sighandler_t)0x1);
  minihttp::InitNetwork();
  atexit(minihttp::StopNetwork);
  this = (HttpSocket *)operator_new(0x238);
  minihttp::HttpSocket::HttpSocket(this);
  (this->super_TcpSocket)._vptr_TcpSocket = (_func_int **)&PTR__HttpSocket_0010ebc8;
  this->_keep_alive = 3;
  minihttp::TcpSocket::SetBufsizeIn((TcpSocket *)this,0x10000);
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"minihttp","");
  std::__cxx11::string::_M_assign((string *)&this->_user_agent);
  if ((_Rb_tree_node_base *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._M_color) + 1);
  }
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"example.com","");
  minihttp::HttpSocket::Download(this,(string *)local_78,(char *)0x0,(void *)0x0,(POST *)0x0);
  if ((_Rb_tree_node_base *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._M_color) + 1);
  }
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"http://www.ietf.org/rfc/rfc2616.txt","");
  minihttp::HttpSocket::Download(this,(string *)local_78,(char *)0x0,(void *)0x0,(POST *)0x0);
  if ((_Rb_tree_node_base *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._M_color) + 1);
  }
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"https://example.com","");
  minihttp::HttpSocket::Download(this,(string *)local_78,(char *)0x0,(void *)0x0,(POST *)0x0);
  if ((_Rb_tree_node_base *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._M_color) + 1);
  }
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"raw.githubusercontent.com/fgenesis/minihttp/master/minihttp.h","");
  minihttp::HttpSocket::Download(this,(string *)local_78,(char *)0x0,(void *)0x0,(POST *)0x0);
  if ((_Rb_tree_node_base *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._M_color) + 1);
  }
  paVar1 = &local_40.data.field_2;
  local_40.data._M_string_length = 0;
  local_40.data.field_2._M_local_buf[0] = '\0';
  local_40.data._M_dataplus._M_p = (pointer)paVar1;
  minihttp::POST::add(&local_40,"a","b");
  minihttp::POST::add(&local_40,"x","y");
  minihttp::POST::add(&local_40,"long string","possibly invalid data: /x/&$+*#\'?!;");
  minihttp::POST::add(&local_40,"normal","data");
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"https://httpbin.org/post","");
  minihttp::HttpSocket::Download(this,(string *)local_78,(char *)0x0,(void *)0x0,&local_40);
  if ((_Rb_tree_node_base *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._M_color) + 1);
  }
  local_78._0_8_ = &PTR__SocketSet_0010ecf8;
  local_68._M_color = 0;
  local_68._M_parent = (_Base_ptr)0x0;
  local_48 = 0;
  local_68._M_left = &local_68;
  local_68._M_right = &local_68;
  minihttp::SocketSet::add((SocketSet *)local_78,(TcpSocket *)this,true);
  while (local_48 != 0) {
    minihttp::SocketSet::update((SocketSet *)local_78);
  }
  minihttp::SocketSet::~SocketSet((SocketSet *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.data._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.data._M_dataplus._M_p,
                    CONCAT71(local_40.data.field_2._M_allocated_capacity._1_7_,
                             local_40.data.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
#ifdef SIGPIPE
    // On *NIX systems, don't signal writing to a closed socket.
    signal(SIGPIPE, SIG_IGN);
#endif

    // minihttp::Download() in example 1 does this automatically,
    // but if this function is not used this has to be called first to init networking properly.
    minihttp::InitNetwork();
    atexit(minihttp::StopNetwork);

    HttpDumpSocket *ht = new HttpDumpSocket;
    ht->SetKeepAlive(3);
    ht->SetBufsizeIn(64 * 1024);
    ht->SetUserAgent("minihttp"); // Let the server know who we are. This is optional but it seems that some servers check that this is set.

    // HTTP GET
    ht->Download("example.com");
    ht->Download("http://www.ietf.org/rfc/rfc2616.txt");
    // Downloads requested in succession will be queued and processed one after another

    // HTTP GET with SSL, if SSL support is enabled:
    ht->Download("https://example.com"); // SSL connection
    ht->Download("raw.githubusercontent.com/fgenesis/minihttp/master/minihttp.h"); // transparent HTTP -> HTTPS redirection

    // Example HTTP POST request:
    minihttp::POST post;
    post.add("a", "b");
    post.add("x", "y");
    post.add("long string", "possibly invalid data: /x/&$+*#'?!;");
    post.add("normal", "data");
    ht->Download("https://httpbin.org/post", NULL, NULL, &post);

    minihttp::SocketSet ss;

    ss.add(ht, true); // true: Delete socket if closed and no task left.

    // This is non-blocking and could be done in background or by another thread.
    // Hogs quite some CPU doing it this way, though.
    while(ss.size())
        ss.update();

    return 0;
}